

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-multiple-listen.c
# Opt level: O0

void client_connect(void)

{
  int iVar1;
  uv_connect_t *req;
  uv_loop_t *loop;
  int r;
  uv_connect_t *connect_req;
  sockaddr_in addr;
  
  req = (uv_connect_t *)malloc(0x60);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&connect_req);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x51,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  if (req == (uv_connect_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x52,"connect_req != NULL");
    abort();
  }
  loop = uv_default_loop();
  iVar1 = uv_tcp_init(loop,&client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x55,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_connect(req,&client,(sockaddr *)&connect_req,connect_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-multiple-listen.c"
            ,0x5b,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(connect_req != NULL);

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_connect(connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);
}